

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O3

EvictionResult * __thiscall
duckdb::BufferPool::EvictBlocksInternal
          (EvictionResult *__return_storage_ptr__,BufferPool *this,EvictionQueue *queue,
          MemoryTag tag,idx_t extra_memory,idx_t memory_limit,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer)

{
  undefined1 *puVar1;
  ulong uVar2;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  BlockHandle *pBVar7;
  type this_00;
  pointer pFVar8;
  __pthread_internal_list *p_Var9;
  ulong uVar10;
  char cVar11;
  __pthread_internal_list *p_Var12;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  BufferEvictionNode node;
  undefined1 local_98 [16];
  BlockManager *local_88;
  undefined1 local_80 [40];
  undefined1 local_58 [24];
  _Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_> _Stack_40;
  __atomic_base<unsigned_long> local_38;
  
  local_98[8] = tag;
  local_80._0_8_ = this;
  MemoryUsage::UpdateUsedMemory(&this->memory_usage,tag,extra_memory);
  uVar2 = (this->memory_usage).memory_usage._M_elems[0xe].super___atomic_base<long>._M_i;
  uVar10 = 0;
  if (0 < (long)uVar2) {
    uVar10 = uVar2;
  }
  local_88 = (BlockManager *)extra_memory;
  local_80._32_8_ = memory_limit;
  if (memory_limit < uVar10) {
    bVar5 = false;
    local_80._8_8_ = __return_storage_ptr__;
    do {
      local_58._16_8_ = 0;
      _Stack_40.super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::FileBuffer_*,_false>)(FileBuffer *)0x0;
      bVar4 = duckdb_moodycamel::
              ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
              ::try_dequeue<duckdb::BufferEvictionNode>
                        (&queue->q,(BufferEvictionNode *)(local_58 + 0x10));
      if (bVar4) {
LAB_00557728:
        BufferEvictionNode::TryGetBlockHandle((BufferEvictionNode *)local_58);
        if ((element_type *)local_58._0_8_ == (element_type *)0x0) {
          LOCK();
          (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
               (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          cVar11 = '\0';
        }
        else {
          pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
          local_80._16_8_ = &pBVar7->lock;
          local_80[0x18] = '\0';
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_80 + 0x10));
          local_80[0x18] = '\x01';
          this_00 = shared_ptr<duckdb::BlockHandle,_true>::operator*
                              ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
          if (local_38._M_i == (this_00->eviction_seq_num).super___atomic_base<unsigned_long>._M_i)
          {
            bVar4 = BlockHandle::CanUnload(this_00);
            if (!bVar4) goto LAB_005577f2;
            if (buffer == (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                           *)0x0) {
LAB_00557862:
              pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                                 ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
              BlockHandle::UnloadAndTakeBlock((BlockHandle *)local_98,(BlockLock *)pBVar7);
              if ((element_type *)local_98._0_8_ != (element_type *)0x0) {
                (*(*(_func_int ***)
                    &(((enable_shared_from_this<duckdb::BlockHandle> *)local_98._0_8_)->__weak_this_
                     ).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>)
                  [1])();
              }
              p_Var9 = (__pthread_internal_list *)
                       (this->memory_usage).memory_usage._M_elems[0xe].super___atomic_base<long>.
                       _M_i;
              p_Var12 = (__pthread_internal_list *)0x0;
              if ((long)p_Var9 < 1) {
                p_Var9 = p_Var12;
              }
              if (p_Var9 <= (ulong)local_80._32_8_) goto LAB_005578a8;
            }
            else {
              pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                                 ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
              pFVar8 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                       ::operator->(&pBVar7->buffer);
              if (pFVar8->internal_size != extra_memory) goto LAB_00557862;
              pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                                 ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
              BlockHandle::UnloadAndTakeBlock((BlockHandle *)local_98,(BlockLock *)pBVar7);
              _Var3._M_head_impl =
                   (buffer->
                   super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>).
                   _M_t.
                   super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
                   .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
              (buffer->
              super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
              super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
              .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl =
                   (FileBuffer *)local_98._0_8_;
              if (_Var3._M_head_impl != (FileBuffer *)0x0) {
                (**(code **)((long)(_Var3._M_head_impl)->_vptr_FileBuffer + 8))();
              }
LAB_005578a8:
              bVar5 = true;
              p_Var12 = (__pthread_internal_list *)0x1;
            }
          }
          else {
LAB_005577f2:
            LOCK();
            (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
                 (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
            UNLOCK();
            p_Var12 = (__pthread_internal_list *)0x0;
          }
          cVar11 = (char)p_Var12;
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_80 + 0x10))
          ;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
      }
      else {
        bVar4 = EvictionQueue::TryDequeueWithLock(queue,(BufferEvictionNode *)(local_58 + 0x10));
        cVar11 = '\x01';
        if (bVar4) goto LAB_00557728;
      }
      if (_Stack_40.super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl !=
          (FileBuffer *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar1 = (undefined1 *)
                   ((long)_Stack_40.super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl
                   + 0xc);
          iVar6 = *(int *)puVar1;
          *(int *)puVar1 = *(int *)puVar1 + -1;
          UNLOCK();
        }
        else {
          iVar6 = *(int *)((long)_Stack_40.super__Head_base<0UL,_duckdb::FileBuffer_*,_false>.
                                 _M_head_impl + 0xc);
          *(int *)((long)_Stack_40.super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl +
                  0xc) = iVar6 + -1;
        }
        if (iVar6 == 1) {
          (**(code **)(*(long *)_Stack_40.super__Head_base<0UL,_duckdb::FileBuffer_*,_false>.
                                _M_head_impl + 0x18))();
        }
      }
    } while (cVar11 == '\0');
    if (bVar5) {
      bVar4 = Allocator::SupportsFlush();
      __return_storage_ptr__ = (EvictionResult *)local_80._8_8_;
      if ((bVar4) &&
         ((this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>.
          _M_i < extra_memory)) {
        Allocator::FlushAll();
      }
    }
    else {
      MemoryUsage::UpdateUsedMemory
                ((MemoryUsage *)(local_80._0_8_ + 0x80),local_98[8],-(long)local_88);
      local_88 = (BlockManager *)0x0;
      __return_storage_ptr__ = (EvictionResult *)local_80._8_8_;
    }
    __return_storage_ptr__->success = bVar5;
  }
  else {
    bVar5 = Allocator::SupportsFlush();
    if ((bVar5) &&
       ((this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>._M_i
        < extra_memory)) {
      Allocator::FlushAll();
    }
    __return_storage_ptr__->success = true;
  }
  (__return_storage_ptr__->reservation).super_BufferPoolReservation.tag = local_98[8];
  (__return_storage_ptr__->reservation).super_BufferPoolReservation.pool =
       (BufferPool *)local_80._0_8_;
  (__return_storage_ptr__->reservation).super_BufferPoolReservation.size = (idx_t)local_88;
  local_88 = (BlockManager *)0x0;
  TempBufferPoolReservation::~TempBufferPoolReservation((TempBufferPoolReservation *)(local_98 + 8))
  ;
  return __return_storage_ptr__;
}

Assistant:

BufferPool::EvictionResult BufferPool::EvictBlocksInternal(EvictionQueue &queue, MemoryTag tag, idx_t extra_memory,
                                                           idx_t memory_limit, unique_ptr<FileBuffer> *buffer) {
	TempBufferPoolReservation r(tag, *this, extra_memory);
	bool found = false;

	if (memory_usage.GetUsedMemory(MemoryUsageCaches::NO_FLUSH) <= memory_limit) {
		if (Allocator::SupportsFlush() && extra_memory > allocator_bulk_deallocation_flush_threshold) {
			Allocator::FlushAll();
		}
		return {true, std::move(r)};
	}

	queue.IterateUnloadableBlocks([&](BufferEvictionNode &, const shared_ptr<BlockHandle> &handle, BlockLock &lock) {
		// hooray, we can unload the block
		if (buffer && handle->GetBuffer(lock)->AllocSize() == extra_memory) {
			// we can re-use the memory directly
			*buffer = handle->UnloadAndTakeBlock(lock);
			found = true;
			return false;
		}

		// release the memory and mark the block as unloaded
		handle->Unload(lock);

		if (memory_usage.GetUsedMemory(MemoryUsageCaches::NO_FLUSH) <= memory_limit) {
			found = true;
			return false;
		}

		// Continue iteration
		return true;
	});

	if (!found) {
		r.Resize(0);
	} else if (Allocator::SupportsFlush() && extra_memory > allocator_bulk_deallocation_flush_threshold) {
		Allocator::FlushAll();
	}

	return {found, std::move(r)};
}